

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Node::GetOutBk(Node *this)

{
  bool bVar1;
  network_address_t nVar2;
  uint32_t uVar3;
  Network *pNVar4;
  ostream *poVar5;
  Block local_290;
  Block local_1f8;
  BlockAddressed local_160;
  undefined1 local_b0 [8];
  BlockAddressed bka;
  Node *this_local;
  
  bka.bk._144_8_ = this;
  BlockAddressed::BlockAddressed((BlockAddressed *)local_b0);
  pNVar4 = Network::instance();
  bVar1 = Network::List_Blocks(pNVar4);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21f9b);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    pNVar4 = Network::instance();
    nVar2 = GetNodeAdd(this);
    Network::RecvBlock(&local_160,pNVar4,nVar2);
    BlockAddressed::operator=((BlockAddressed *)local_b0,&local_160);
    BlockAddressed::~BlockAddressed(&local_160);
    Block::Block(&local_290,(Block *)&bka);
    Blockchain::AddBlock(&local_1f8,&this->bChain,&local_290);
    Block::~Block(&local_1f8);
    Block::~Block(&local_290);
    nVar2 = GetNodeAdd(this);
    if (nVar2 == 3) {
      poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21f20);
      nVar2 = GetNodeAdd(this);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,nVar2);
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_21f6f);
      uVar3 = Block::GetBIndex((Block *)&bka);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_21f85);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  BlockAddressed::~BlockAddressed((BlockAddressed *)local_b0);
  return;
}

Assistant:

void Node::GetOutBk() {
  BlockAddressed bka;
  if (!Network::instance().List_Blocks())
  {
     bka = Network::instance().RecvBlock(GetNodeAdd());
     bChain.AddBlock(bka.bk);
     if (GetNodeAdd() == 3)
      std::cout << "节点：" << GetNodeAdd() <<" 添加第 "<< bka.bk.GetBIndex() <<" 个区块. "<< std::endl;
    //std::cout << "Merkle_root:" << bka.bk.GetMerkleRoot()<<std::endl;
  }
  else
    std::cout << "区块列表为空！"<<std::endl;
}